

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraph::SubdivMeshNode::print(SubdivMeshNode *this,ostream *cout,int depth)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"SubdivMeshNode @ ",0x11);
  poVar1 = std::ostream::_M_insert<void_const*>(cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," { closed = ",0xc);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void SceneGraph::SubdivMeshNode::print(std::ostream& cout, int depth) {
    cout << "SubdivMeshNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }